

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTask.h
# Opt level: O0

HighsSplitDeque * __thiscall HighsTask::markAsFinished(HighsTask *this,HighsSplitDeque *stealer)

{
  ulong uVar1;
  HighsSplitDeque *waitingOwner;
  uintptr_t state;
  HighsSplitDeque *stealer_local;
  HighsTask *this_local;
  HighsSplitDeque *local_30;
  
  LOCK();
  uVar1 = (this->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
  (this->metadata).stealer.super___atomic_base<unsigned_long>._M_i = 1;
  UNLOCK();
  local_30 = (HighsSplitDeque *)(uVar1 & 0xfffffffffffffffc);
  if (local_30 == stealer) {
    local_30 = (HighsSplitDeque *)0x0;
  }
  return local_30;
}

Assistant:

HighsSplitDeque* markAsFinished(HighsSplitDeque* stealer) {
    uintptr_t state =
        metadata.stealer.exchange(kFinishedFlag, std::memory_order_release);
    HighsSplitDeque* waitingOwner =
        reinterpret_cast<HighsSplitDeque*>(state & kPtrMask);
    if (waitingOwner != stealer) return waitingOwner;

    return nullptr;
  }